

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_triplet_to_line<charls::transform_hp2<unsigned_short>,unsigned_short>
               (triplet<unsigned_short> *source,size_t pixel_stride_in,unsigned_short *destination,
               size_t pixel_stride,transform_hp2<unsigned_short> *transform,uint32_t mask)

{
  triplet<unsigned_short> tVar1;
  anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 *paVar2;
  size_t sVar3;
  
  if (pixel_stride <= pixel_stride_in) {
    pixel_stride_in = pixel_stride;
  }
  paVar2 = &source->field_2;
  for (sVar3 = 0; pixel_stride_in != sVar3; sVar3 = sVar3 + 1) {
    tVar1 = transform_hp2<unsigned_short>::operator()
                      (transform,(((triplet<unsigned_short> *)(paVar2 + -2))->field_0).v1 & mask,
                       ((anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 *)(paVar2 + -1))->v2
                       & mask,paVar2->v3 & mask);
    ((anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1 *)(destination + sVar3))->v1 =
         (unsigned_short)tVar1.field_0;
    ((anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 *)(destination + pixel_stride + sVar3))
    ->v2 = (unsigned_short)tVar1.field_1;
    ((anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 *)
    (destination + pixel_stride * 2 + sVar3))->v3 = (unsigned_short)tVar1.field_2;
    paVar2 = paVar2 + 3;
  }
  return;
}

Assistant:

void transform_triplet_to_line(const triplet<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                               const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    const triplet<PixelType>* type_buffer_in{source};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const triplet<PixelType> color{type_buffer_in[i]};
        const triplet<PixelType> color_transformed{transform(color.v1 & mask, color.v2 & mask, color.v3 & mask)};

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
    }
}